

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  tar *tar_00;
  int64_t iVar1;
  tar *tar;
  sparse_block *p;
  int64_t request;
  int64_t bytes_skipped;
  archive_read *a_local;
  
  tar_00 = (tar *)a->format->data;
  p = (sparse_block *)0x0;
  tar = (tar *)tar_00->sparse_list;
  do {
    if (tar == (tar *)0x0) {
      if (tar_00->entry_bytes_remaining < (long)p) {
        p = (sparse_block *)tar_00->entry_bytes_remaining;
      }
      iVar1 = __archive_read_consume
                        (a,(long)&p->next + tar_00->entry_padding + tar_00->entry_bytes_unconsumed);
      if (iVar1 < 0) {
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        tar_00->entry_bytes_remaining = 0;
        tar_00->entry_bytes_unconsumed = 0;
        tar_00->entry_padding = 0;
        gnu_clear_sparse_list(tar_00);
        a_local._4_4_ = L'\0';
      }
      return a_local._4_4_;
    }
    if (*(int *)&(tar->entry_pathname_override).s == 0) {
      if (0x7fffffffffffffff - (long)p <= (long)(tar->entry_pathname).buffer_length) {
        return L'\xffffffe2';
      }
      p = (sparse_block *)((long)&p->next + (tar->entry_pathname).buffer_length);
    }
    tar = (tar *)(tar->entry_pathname).s;
  } while( true );
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	int64_t request;
	struct sparse_block *p;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	/* Do not consume the hole of a sparse file. */
	request = 0;
	for (p = tar->sparse_list; p != NULL; p = p->next) {
		if (!p->hole) {
			if (p->remaining >= INT64_MAX - request) {
				return ARCHIVE_FATAL;
			}
			request += p->remaining;
		}
	}
	if (request > tar->entry_bytes_remaining)
		request = tar->entry_bytes_remaining;
	request += tar->entry_padding + tar->entry_bytes_unconsumed;

	bytes_skipped = __archive_read_consume(a, request);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}